

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipField(ParserImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  _Alloc_hider _Var6;
  string field_name;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"[","");
  bVar4 = TryConsume(this,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    bVar4 = ConsumeTypeUrlOrFullTypeName(this,&local_50);
    if (bVar4) {
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"]","");
      bVar4 = ConsumeBeforeWhitespace(this,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) goto LAB_002586ac;
    }
  }
  else {
    bVar4 = ConsumeIdentifierBeforeWhitespace(this,&local_50);
    if (bVar4) {
LAB_002586ac:
      TryConsumeWhitespace(this);
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,":","");
      bVar4 = TryConsumeBeforeWhitespace(this,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) {
        TryConsumeWhitespace(this);
        local_90._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"{","");
        _Var6._M_p = local_90._M_dataplus._M_p;
        sVar2 = (this->tokenizer_).current_.text._M_string_length;
        if ((sVar2 == local_90._M_string_length) &&
           ((sVar2 == 0 ||
            (iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                          local_90._M_dataplus._M_p,sVar2), iVar5 == 0)))) {
          bVar4 = false;
        }
        else {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"<","");
          _Var3._M_p = local_70._M_dataplus._M_p;
          sVar2 = (this->tokenizer_).current_.text._M_string_length;
          if (sVar2 == local_70._M_string_length) {
            if (sVar2 == 0) {
              bVar4 = false;
            }
            else {
              iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                           local_70._M_dataplus._M_p,sVar2);
              bVar4 = iVar5 != 0;
            }
          }
          else {
            bVar4 = true;
          }
          _Var6._M_p = local_90._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var3._M_p != &local_70.field_2) {
            operator_delete(_Var3._M_p,local_70.field_2._M_allocated_capacity + 1);
            _Var6._M_p = local_90._M_dataplus._M_p;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var6._M_p != paVar1) {
          operator_delete(_Var6._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (bVar4) {
          bVar4 = SkipFieldValue(this);
        }
        else {
          bVar4 = SkipFieldMessage(this);
        }
      }
      else {
        bVar4 = SkipFieldMessage(this);
      }
      if (bVar4 != false) {
        local_90._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,";","");
        bVar4 = TryConsume(this,&local_90);
        if (!bVar4) {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,",","");
          TryConsume(this,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        bVar4 = true;
        goto LAB_00258886;
      }
    }
  }
  bVar4 = false;
LAB_00258886:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool SkipField() {
    std::string field_name;
    if (TryConsume("[")) {
      // Extension name or type URL.
      DO(ConsumeTypeUrlOrFullTypeName(&field_name));
      DO(ConsumeBeforeWhitespace("]"));
    } else {
      DO(ConsumeIdentifierBeforeWhitespace(&field_name));
    }
    TryConsumeWhitespace();

    // Try to guess the type of this field.
    // If this field is not a message, there should be a ":" between the
    // field name and the field value and also the field value should not
    // start with "{" or "<" which indicates the beginning of a message body.
    // If there is no ":" or there is a "{" or "<" after ":", this field has
    // to be a message or the input is ill-formed.
    if (TryConsumeBeforeWhitespace(":")) {
      TryConsumeWhitespace();
      if (!LookingAt("{") && !LookingAt("<")) {
        DO(SkipFieldValue());
      } else {
        DO(SkipFieldMessage());
      }
    } else {
      DO(SkipFieldMessage());
    }
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");
    return true;
  }